

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void updateVirtualTable(Parse *pParse,SrcList *pSrc,Table *pTab,ExprList *pChanges,Expr *pRowid,
                       int *aXRef,Expr *pWhere,int onError)

{
  int p1;
  sqlite3 *db;
  Vdbe *p;
  uint uVar1;
  int iVar2;
  VTable *zP4;
  Expr *pEVar3;
  ExprList *pList;
  Select *p_00;
  Parse *pPVar4;
  uint p2;
  long lVar5;
  int iVar6;
  int p3;
  int iVar7;
  long lVar8;
  SelectDest dest;
  undefined8 local_40;
  undefined8 local_38;
  
  db = pParse->db;
  for (zP4 = pTab->pVTable; (zP4 != (VTable *)0x0 && (zP4->db != db)); zP4 = zP4->pNext) {
  }
  p = pParse->pVdbe;
  local_40 = "_rowid_";
  local_38._0_4_ = 7;
  pEVar3 = sqlite3ExprAlloc(db,0x1a,(Token *)&local_40,0);
  pList = sqlite3ExprListAppend(pParse,(ExprList *)0x0,pEVar3);
  if (pRowid != (Expr *)0x0) {
    pEVar3 = exprDup(db,pRowid,0,(u8 **)0x0);
    pList = sqlite3ExprListAppend(pParse,pList,pEVar3);
  }
  if (0 < pTab->nCol) {
    lVar5 = 0;
    lVar8 = 0;
    do {
      if ((long)aXRef[lVar8] < 0) {
        pEVar3 = sqlite3Expr(db,0x1a,*(char **)((long)&pTab->aCol->zName + lVar5));
      }
      else {
        pEVar3 = exprDup(db,pChanges->a[aXRef[lVar8]].pExpr,0,(u8 **)0x0);
      }
      pList = sqlite3ExprListAppend(pParse,pList,pEVar3);
      lVar8 = lVar8 + 1;
      lVar5 = lVar5 + 0x30;
    } while (lVar8 < pTab->nCol);
  }
  p_00 = sqlite3SelectNew(pParse,pList,pSrc,pWhere,(ExprList *)0x0,(Expr *)0x0,(ExprList *)0x0,0,
                          (Expr *)0x0,(Expr *)0x0);
  p1 = pParse->nTab;
  pParse->nTab = p1 + 1;
  sqlite3VdbeAddOp3(p,0x2a,p1,(pRowid != (Expr *)0x0) + 1 + (int)pTab->nCol,0);
  if (p->aOp != (Op *)0x0) {
    p->aOp[(long)p->nOp + -1].p5 = '\b';
  }
  local_40 = (char *)CONCAT62(local_40._2_6_,8);
  local_40 = (char *)CONCAT44(p1,(undefined4)local_40);
  local_38._0_4_ = 0;
  local_38._4_4_ = 0;
  sqlite3Select(pParse,p_00,(SelectDest *)&local_40);
  iVar2 = pParse->nMem;
  p3 = iVar2 + 1;
  pParse->nMem = p3;
  pParse->nMem = pTab->nCol + iVar2 + 2;
  uVar1 = sqlite3VdbeAddOp3(p,0x48,p1,0,0);
  sqlite3VdbeAddOp3(p,0x1d,p1,0,p3);
  p2 = (uint)(pRowid != (Expr *)0x0);
  sqlite3VdbeAddOp3(p,0x1d,p1,p2,iVar2 + 2);
  if (0 < pTab->nCol) {
    iVar7 = 0;
    do {
      iVar6 = iVar7 + 1;
      sqlite3VdbeAddOp3(p,0x1d,p1,p2 + 1 + iVar7,iVar7 + iVar2 + 3);
      iVar7 = iVar6;
    } while (iVar6 < pTab->nCol);
  }
  sqlite3VtabMakeWritable(pParse,pTab);
  iVar2 = sqlite3VdbeAddOp3(p,0x8c,0,pTab->nCol + 2,p3);
  sqlite3VdbeChangeP4(p,iVar2,(char *)zP4,-10);
  if (p->aOp != (Op *)0x0) {
    iVar2 = 2;
    if (onError != 99) {
      iVar2 = onError;
    }
    p->aOp[(long)p->nOp + -1].p5 = (u8)iVar2;
  }
  pPVar4 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar4 = pParse;
  }
  pPVar4->mayAbort = '\x01';
  sqlite3VdbeAddOp3(p,0x5f,p1,uVar1 + 1,0);
  if ((-1 < (int)uVar1) && (uVar1 < (uint)p->nOp)) {
    p->aOp[uVar1].p2 = p->nOp;
  }
  sqlite3VdbeAddOp3(p,0x2d,p1,0,0);
  sqlite3SelectDelete(db,p_00);
  return;
}

Assistant:

static void updateVirtualTable(
  Parse *pParse,       /* The parsing context */
  SrcList *pSrc,       /* The virtual table to be modified */
  Table *pTab,         /* The virtual table */
  ExprList *pChanges,  /* The columns to change in the UPDATE statement */
  Expr *pRowid,        /* Expression used to recompute the rowid */
  int *aXRef,          /* Mapping from columns of pTab to entries in pChanges */
  Expr *pWhere,        /* WHERE clause of the UPDATE statement */
  int onError          /* ON CONFLICT strategy */
){
  Vdbe *v = pParse->pVdbe;  /* Virtual machine under construction */
  ExprList *pEList = 0;     /* The result set of the SELECT statement */
  Select *pSelect = 0;      /* The SELECT statement */
  Expr *pExpr;              /* Temporary expression */
  int ephemTab;             /* Table holding the result of the SELECT */
  int i;                    /* Loop counter */
  int addr;                 /* Address of top of loop */
  int iReg;                 /* First register in set passed to OP_VUpdate */
  sqlite3 *db = pParse->db; /* Database connection */
  const char *pVTab = (const char*)sqlite3GetVTable(db, pTab);
  SelectDest dest;

  /* Construct the SELECT statement that will find the new values for
  ** all updated rows. 
  */
  pEList = sqlite3ExprListAppend(pParse, 0, sqlite3Expr(db, TK_ID, "_rowid_"));
  if( pRowid ){
    pEList = sqlite3ExprListAppend(pParse, pEList,
                                   sqlite3ExprDup(db, pRowid, 0));
  }
  assert( pTab->iPKey<0 );
  for(i=0; i<pTab->nCol; i++){
    if( aXRef[i]>=0 ){
      pExpr = sqlite3ExprDup(db, pChanges->a[aXRef[i]].pExpr, 0);
    }else{
      pExpr = sqlite3Expr(db, TK_ID, pTab->aCol[i].zName);
    }
    pEList = sqlite3ExprListAppend(pParse, pEList, pExpr);
  }
  pSelect = sqlite3SelectNew(pParse, pEList, pSrc, pWhere, 0, 0, 0, 0, 0, 0);
  
  /* Create the ephemeral table into which the update results will
  ** be stored.
  */
  assert( v );
  ephemTab = pParse->nTab++;
  sqlite3VdbeAddOp2(v, OP_OpenEphemeral, ephemTab, pTab->nCol+1+(pRowid!=0));
  sqlite3VdbeChangeP5(v, BTREE_UNORDERED);

  /* fill the ephemeral table 
  */
  sqlite3SelectDestInit(&dest, SRT_Table, ephemTab);
  sqlite3Select(pParse, pSelect, &dest);

  /* Generate code to scan the ephemeral table and call VUpdate. */
  iReg = ++pParse->nMem;
  pParse->nMem += pTab->nCol+1;
  addr = sqlite3VdbeAddOp2(v, OP_Rewind, ephemTab, 0);
  sqlite3VdbeAddOp3(v, OP_Column,  ephemTab, 0, iReg);
  sqlite3VdbeAddOp3(v, OP_Column, ephemTab, (pRowid?1:0), iReg+1);
  for(i=0; i<pTab->nCol; i++){
    sqlite3VdbeAddOp3(v, OP_Column, ephemTab, i+1+(pRowid!=0), iReg+2+i);
  }
  sqlite3VtabMakeWritable(pParse, pTab);
  sqlite3VdbeAddOp4(v, OP_VUpdate, 0, pTab->nCol+2, iReg, pVTab, P4_VTAB);
  sqlite3VdbeChangeP5(v, onError==OE_Default ? OE_Abort : onError);
  sqlite3MayAbort(pParse);
  sqlite3VdbeAddOp2(v, OP_Next, ephemTab, addr+1);
  sqlite3VdbeJumpHere(v, addr);
  sqlite3VdbeAddOp2(v, OP_Close, ephemTab, 0);

  /* Cleanup */
  sqlite3SelectDelete(db, pSelect);  
}